

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticModelTester.cpp
# Opt level: O0

void __thiscall psy::C::SemanticModelTester::case0353(SemanticModelTester *this)

{
  bool bVar1;
  TypeKind TVar2;
  BasicTypeKind BVar3;
  int iVar4;
  __tuple_element_t<0UL,_tuple<const_StructOrUnionDeclarationSyntax_*,_const_SemanticModel_*>_>
  *ppSVar5;
  __tuple_element_t<1UL,_tuple<const_StructOrUnionDeclarationSyntax_*,_const_SemanticModel_*>_>
  *ppSVar6;
  TagTypeSpecifierSyntax *this_00;
  DeclarationListSyntax *pDVar7;
  undefined4 extraout_var;
  size_type sVar8;
  ostream *poVar9;
  void *pvVar10;
  undefined8 uVar11;
  reference ppFVar12;
  Lexeme *pLVar13;
  Type *pTVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  string local_1f8;
  string local_1d8;
  MemberDeclarationSymbol *local_1b8;
  FieldDeclarationSymbol *fldDeclSym1_1;
  string local_190;
  MemberDeclarationSymbol *local_170;
  FieldDeclarationSymbol *fldDeclSym1_0;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  fldDeclSyms1;
  FieldDeclarationSyntax *fldDeclNode1;
  string local_128;
  MemberDeclarationSymbol *local_108;
  FieldDeclarationSymbol *fldDeclSym0_1;
  string local_e0;
  MemberDeclarationSymbol *local_c0;
  FieldDeclarationSymbol *fldDeclSym0_0;
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  fldDeclSyms0;
  FieldDeclarationSyntax *fldDeclNode0;
  TagTypeSpecifierSyntax *tySpec;
  type *semaModel;
  type *tyDeclNode;
  string local_78 [55];
  allocator<char> local_41;
  string local_40;
  undefined1 local_20 [24];
  SemanticModelTester *this_local;
  
  local_20._16_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"struct x { int y , z ; double * k, w ; } ;",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"",(allocator<char> *)((long)&tyDeclNode + 7));
  compile<psy::C::StructOrUnionDeclarationSyntax>
            ((SemanticModelTester *)local_20,(string *)this,&local_40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tyDeclNode + 7));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  ppSVar5 = std::get<0ul,psy::C::StructOrUnionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                      ((tuple<const_psy::C::StructOrUnionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                        *)local_20);
  ppSVar6 = std::get<1ul,psy::C::StructOrUnionDeclarationSyntax_const*,psy::C::SemanticModel_const*>
                      ((tuple<const_psy::C::StructOrUnionDeclarationSyntax_*,_const_psy::C::SemanticModel_*>
                        *)local_20);
  this_00 = TagDeclarationSyntax::typeSpecifier(&(*ppSVar5)->super_TagDeclarationSyntax);
  pDVar7 = TagTypeSpecifierSyntax::declarations(this_00);
  iVar4 = (*(((pDVar7->
              super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
              ).
              super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x1c])();
  fldDeclSyms0.
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar4);
  SemanticModel::fieldsFor
            ((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
              *)&fldDeclSym0_0,*ppSVar6,
             (FieldDeclarationSyntax *)
             fldDeclSyms0.
             super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar8 = std::
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          ::size((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                  *)&fldDeclSym0_0);
  if (sVar8 != 2) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    sVar8 = std::
            vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            ::size((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                    *)&fldDeclSym0_0);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar8);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x291);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  ppFVar12 = std::
             vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                           *)&fldDeclSym0_0,0);
  local_c0 = &(*ppFVar12)->super_MemberDeclarationSymbol;
  if (local_c0 == (MemberDeclarationSymbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x294);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pLVar13 = &MemberDeclarationSymbol::name(local_c0)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_e0,pLVar13);
  bVar1 = std::operator==(&local_e0,"y");
  std::__cxx11::string::~string((string *)&local_e0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pLVar13 = &MemberDeclarationSymbol::name(local_c0)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&fldDeclSym0_1,pLVar13);
    poVar9 = std::operator<<(poVar9,(string *)&fldDeclSym0_1);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = std::operator<<(poVar9,"y");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x295);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&fldDeclSym0_1);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_c0);
  TVar2 = Type::kind(pTVar14);
  if (TVar2 != Basic) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_c0);
    TVar2 = Type::kind(pTVar14);
    poVar9 = ::operator<<(poVar9,TVar2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = ::operator<<(poVar9,Basic);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x296);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_c0);
  iVar4 = (*pTVar14->_vptr_Type[5])();
  BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_00,iVar4));
  if (BVar3 != Int_S) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_c0);
    iVar4 = (*pTVar14->_vptr_Type[5])();
    BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_01,iVar4));
    poVar9 = C::operator<<(poVar9,BVar3);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,Int_S);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x297);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  ppFVar12 = std::
             vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                           *)&fldDeclSym0_0,1);
  local_108 = &(*ppFVar12)->super_MemberDeclarationSymbol;
  pLVar13 = &MemberDeclarationSymbol::name(local_108)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_128,pLVar13);
  bVar1 = std::operator==(&local_128,"z");
  std::__cxx11::string::~string((string *)&local_128);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pLVar13 = &MemberDeclarationSymbol::name(local_108)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&fldDeclNode1,pLVar13);
    poVar9 = std::operator<<(poVar9,(string *)&fldDeclNode1);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = std::operator<<(poVar9,"z");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x29a);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&fldDeclNode1);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_108);
  TVar2 = Type::kind(pTVar14);
  if (TVar2 != Basic) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_108);
    TVar2 = Type::kind(pTVar14);
    poVar9 = ::operator<<(poVar9,TVar2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = ::operator<<(poVar9,Basic);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x29b);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_108);
  iVar4 = (*pTVar14->_vptr_Type[5])();
  BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_02,iVar4));
  if (BVar3 != Int_S) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_108);
    iVar4 = (*pTVar14->_vptr_Type[5])();
    BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_03,iVar4));
    poVar9 = C::operator<<(poVar9,BVar3);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,Int_S);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x29c);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pDVar7 = TagTypeSpecifierSyntax::declarations(this_00);
  iVar4 = (*(((((pDVar7->
                super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
                ).
                super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
               .next)->
              super_CoreSyntaxNodeList<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
              ).
              super_List<psy::C::DeclarationSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::DeclarationSyntax_*>_>
             .value)->super_SyntaxNode).super_Managed._vptr_Managed[0x1c])();
  fldDeclSyms1.
  super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_04,iVar4);
  SemanticModel::fieldsFor
            ((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
              *)&fldDeclSym1_0,*ppSVar6,
             (FieldDeclarationSyntax *)
             fldDeclSyms1.
             super__Vector_base<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar8 = std::
          vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
          ::size((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                  *)&fldDeclSym1_0);
  if (sVar8 != 2) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    sVar8 = std::
            vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
            ::size((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                    *)&fldDeclSym1_0);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,sVar8);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2a0);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  ppFVar12 = std::
             vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                           *)&fldDeclSym1_0,0);
  local_170 = &(*ppFVar12)->super_MemberDeclarationSymbol;
  if (local_170 == (MemberDeclarationSymbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2a3);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pLVar13 = &MemberDeclarationSymbol::name(local_170)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_190,pLVar13);
  bVar1 = std::operator==(&local_190,"k");
  std::__cxx11::string::~string((string *)&local_190);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pLVar13 = &MemberDeclarationSymbol::name(local_170)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_((string *)&fldDeclSym1_1,pLVar13);
    poVar9 = std::operator<<(poVar9,(string *)&fldDeclSym1_1);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = std::operator<<(poVar9,"k");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2a4);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&fldDeclSym1_1);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_170);
  TVar2 = Type::kind(pTVar14);
  if (TVar2 != Pointer) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_170);
    TVar2 = Type::kind(pTVar14);
    poVar9 = ::operator<<(poVar9,TVar2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = ::operator<<(poVar9,Pointer);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2a5);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  ppFVar12 = std::
             vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             ::operator[]((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
                           *)&fldDeclSym1_0,1);
  local_1b8 = &(*ppFVar12)->super_MemberDeclarationSymbol;
  if (local_1b8 == (MemberDeclarationSymbol *)0x0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpression is NOT ");
    poVar9 = std::operator<<(poVar9,"true");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2a8);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pLVar13 = &MemberDeclarationSymbol::name(local_1b8)->super_Lexeme;
  Lexeme::valueText_abi_cxx11_(&local_1d8,pLVar13);
  bVar1 = std::operator==(&local_1d8,"w");
  std::__cxx11::string::~string((string *)&local_1d8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pLVar13 = &MemberDeclarationSymbol::name(local_1b8)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_1f8,pLVar13);
    poVar9 = std::operator<<(poVar9,(string *)&local_1f8);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = std::operator<<(poVar9,"w");
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2a9);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_1f8);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_1b8);
  TVar2 = Type::kind(pTVar14);
  if (TVar2 != Basic) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_1b8);
    TVar2 = Type::kind(pTVar14);
    poVar9 = ::operator<<(poVar9,TVar2);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = ::operator<<(poVar9,Basic);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2aa);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  pTVar14 = MemberDeclarationSymbol::type(local_1b8);
  iVar4 = (*pTVar14->_vptr_Type[5])();
  BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_05,iVar4));
  if (BVar3 != Double) {
    poVar9 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
    poVar9 = std::operator<<(poVar9,"\t\tActual  : ");
    pTVar14 = MemberDeclarationSymbol::type(local_1b8);
    iVar4 = (*pTVar14->_vptr_Type[5])();
    BVar3 = BasicType::kind((BasicType *)CONCAT44(extraout_var_06,iVar4));
    poVar9 = C::operator<<(poVar9,BVar3);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\tExpected: ");
    poVar9 = C::operator<<(poVar9,Double);
    poVar9 = std::operator<<(poVar9,"\n");
    poVar9 = std::operator<<(poVar9,"\t\t");
    poVar9 = std::operator<<(poVar9,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/SemanticModelTester.cpp"
                            );
    poVar9 = std::operator<<(poVar9,":");
    pvVar10 = (void *)std::ostream::operator<<(poVar9,0x2ab);
    std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
    uVar11 = __cxa_allocate_exception(1);
    __cxa_throw(uVar11,&TestFailed::typeinfo,0);
  }
  std::
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  ::~vector((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             *)&fldDeclSym1_0);
  std::
  vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
  ::~vector((vector<const_psy::C::FieldDeclarationSymbol_*,_std::allocator<const_psy::C::FieldDeclarationSymbol_*>_>
             *)&fldDeclSym0_0);
  return;
}

Assistant:

void SemanticModelTester::case0353()
{
    auto [tyDeclNode, semaModel] =
            compile<StructOrUnionDeclarationSyntax>("struct x { int y , z ; double * k, w ; } ;");

    auto tySpec = tyDeclNode->typeSpecifier();

    auto fldDeclNode0 = tySpec->declarations()->value->asFieldDeclaration();
    std::vector<const FieldDeclarationSymbol*> fldDeclSyms0 = semaModel->fieldsFor(fldDeclNode0);
    PSY_EXPECT_EQ_INT(fldDeclSyms0.size(), 2);

    const FieldDeclarationSymbol* fldDeclSym0_0 = fldDeclSyms0[0];
    PSY_EXPECT_TRUE(fldDeclSym0_0);
    PSY_EXPECT_EQ_STR(fldDeclSym0_0->name()->valueText(), "y");
    PSY_EXPECT_EQ_ENU(fldDeclSym0_0->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym0_0->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    const FieldDeclarationSymbol* fldDeclSym0_1 = fldDeclSyms0[1];
    PSY_EXPECT_EQ_STR(fldDeclSym0_1->name()->valueText(), "z");
    PSY_EXPECT_EQ_ENU(fldDeclSym0_1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym0_1->type()->asBasicType()->kind(), BasicTypeKind::Int_S, BasicTypeKind);

    auto fldDeclNode1 = tySpec->declarations()->next->value->asFieldDeclaration();
    std::vector<const FieldDeclarationSymbol*> fldDeclSyms1 = semaModel->fieldsFor(fldDeclNode1);
    PSY_EXPECT_EQ_INT(fldDeclSyms1.size(), 2);

    const FieldDeclarationSymbol* fldDeclSym1_0 = fldDeclSyms1[0];
    PSY_EXPECT_TRUE(fldDeclSym1_0);
    PSY_EXPECT_EQ_STR(fldDeclSym1_0->name()->valueText(), "k");
    PSY_EXPECT_EQ_ENU(fldDeclSym1_0->type()->kind(), TypeKind::Pointer, TypeKind);

    const FieldDeclarationSymbol* fldDeclSym1_1 = fldDeclSyms1[1];
    PSY_EXPECT_TRUE(fldDeclSym1_1);
    PSY_EXPECT_EQ_STR(fldDeclSym1_1->name()->valueText(), "w");
    PSY_EXPECT_EQ_ENU(fldDeclSym1_1->type()->kind(), TypeKind::Basic, TypeKind);
    PSY_EXPECT_EQ_ENU(fldDeclSym1_1->type()->asBasicType()->kind(), BasicTypeKind::Double, BasicTypeKind);
}